

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  iterator iStack_b8;
  int e;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  const_iterator local_88;
  int local_7c;
  iterator iStack_78;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  int local_58 [2];
  int x;
  string local_48 [8];
  string s;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  int round;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 0;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  while ((int)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage != 0) {
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + -1;
    std::__cxx11::string::string(local_48);
    std::operator>>((istream *)&std::cin,local_48);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"pb");
    if (bVar1) {
      std::istream::operator>>((istream *)&std::cin,local_58);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_28,local_58);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"sa");
      if (bVar1) {
        local_60._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_28);
        local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)local_28);
        std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_60,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            local_68);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"sd");
        if (bVar1) {
          local_70._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)local_28);
          iStack_78 = std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_28);
          std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (local_70,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                              iStack_78._M_current);
          reverse((vector<int,_std::allocator<int>_> *)local_28);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"r");
          if (bVar1) {
            reverse((vector<int,_std::allocator<int>_> *)local_28);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"d");
            if (bVar1) {
              std::istream::operator>>((istream *)&std::cin,&local_7c);
              local_98._M_current =
                   (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)local_28);
              local_90 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+(&local_98,(long)local_7c);
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)
                         &local_88,&local_90);
              std::vector<int,_std::allocator<int>_>::erase
                        ((vector<int,_std::allocator<int>_> *)local_28,local_88);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _0_4_ = (int)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + -1;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_28);
  iStack_b8 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff48), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
    int round;
    cin >> round;
    vector<int> v;
    while (round--) {
        string s;
        cin >> s;

        if (s == "pb") {
            int x;
            cin >> x;
            v.push_back(x);
        } else if (s == "sa") {
            sort(v.begin(), v.end());
        } else if (s == "sd") {
            sort(v.begin(), v.end());
            reverse(v);
        } else if (s == "r") {
            reverse(v);
        } else if (s == "d") {
            int i;
            cin >> i;
            v.erase(v.begin() + i);
        }
    }
    for (auto e : v) {
        cout << e << " ";
    }
    cout << "\n";
}